

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::stepPositionsMultiDof(btMultiBody *this,btScalar dt,btScalar *pq,btScalar *pqd)

{
  uint uVar1;
  uint uVar2;
  btMultibodyLink *pbVar3;
  btVector3 *pbVar4;
  long lVar5;
  btScalar *pbVar6;
  float *pfVar7;
  btScalar (*pabVar8) [4];
  btScalar *pbVar9;
  float *pfVar10;
  btQuaternion *pbVar11;
  btScalar (*pq_00) [4];
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  uVar1 = (this->m_links).m_size;
  pbVar4 = (btVector3 *)(pq + 4);
  if (pq == (btScalar *)0x0) {
    pbVar4 = &this->m_basePos;
  }
  pbVar11 = &this->m_baseQuat;
  if (pq != (btScalar *)0x0) {
    pbVar11 = (btQuaternion *)pq;
  }
  pbVar6 = (this->m_realBuf).m_data;
  if (pqd != (btScalar *)0x0) {
    pbVar6 = pqd;
  }
  pbVar4->m_floats[0] = pbVar6[3] * dt + pbVar4->m_floats[0];
  pbVar4->m_floats[1] = pbVar6[4] * dt + pbVar4->m_floats[1];
  pbVar4->m_floats[2] = pbVar6[5] * dt + pbVar4->m_floats[2];
  pbVar9 = (this->m_realBuf).m_data;
  if (pqd != (btScalar *)0x0) {
    pbVar9 = pqd;
  }
  if (stepPositionsMultiDof(float,float*,float*)::baseQuat == '\0') {
    stepPositionsMultiDof();
  }
  stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats =
       *(btQuadWord *)(pbVar11->super_btQuadWord).m_floats;
  if (stepPositionsMultiDof(float,float*,float*)::baseOmega == '\0') {
    stepPositionsMultiDof();
  }
  stepPositionsMultiDof::baseOmega.m_floats._0_8_ = *(undefined8 *)pbVar9;
  stepPositionsMultiDof::baseOmega.m_floats[2] = pbVar9[2];
  stepPositionsMultiDof::baseOmega.m_floats[3] = 0.0;
  stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
            ((anon_struct_1_0_00000001 *)&stepPositionsMultiDof::baseOmega,
             (btVector3 *)&stepPositionsMultiDof::baseQuat,(btQuaternion *)0x1,SUB81(pbVar6,0),dt);
  (pbVar11->super_btQuadWord).m_floats[0] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[0];
  (pbVar11->super_btQuadWord).m_floats[1] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[1];
  (pbVar11->super_btQuadWord).m_floats[2] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[2];
  (pbVar11->super_btQuadWord).m_floats[3] =
       stepPositionsMultiDof::baseQuat.super_btQuadWord.m_floats[3];
  if (0 < (int)uVar1) {
    pfVar7 = pqd + 6;
    pq_00 = (btScalar (*) [4])(pq + 7);
    if (pq == (btScalar *)0x0) {
      pq_00 = (btScalar (*) [4])0x0;
    }
    if (pqd == (btScalar *)0x0) {
      pfVar7 = (float *)0x0;
    }
    lVar12 = 0;
    do {
      pbVar3 = (this->m_links).m_data;
      pabVar8 = (btScalar (*) [4])((long)pbVar3->m_jointPos + lVar12);
      if (pq_00 != (btScalar (*) [4])0x0) {
        pabVar8 = pq_00;
      }
      pfVar10 = pfVar7;
      if (pfVar7 == (float *)0x0) {
        pbVar6 = (this->m_realBuf).m_data;
        pfVar10 = pbVar6 + (long)*(int *)((long)(pbVar3->m_cachedRotParentToThis).super_btQuadWord.
                                                m_floats + lVar12 + -8) + 6;
      }
      uVar2 = *(uint *)((long)(pbVar3->m_cachedWorldTransform).m_basis.m_el[0].m_floats +
                       lVar12 + -0xc);
      if (uVar2 < 2) {
        (*pabVar8)[0] = *pfVar10 * dt + (*pabVar8)[0];
      }
      else if (uVar2 == 2) {
        if (stepPositionsMultiDof(float,float*,float*)::jointVel == '\0') {
          stepPositionsMultiDof();
        }
        stepPositionsMultiDof::jointVel.m_floats._0_8_ = *(undefined8 *)pfVar10;
        stepPositionsMultiDof::jointVel.m_floats[2] = pfVar10[2];
        stepPositionsMultiDof::jointVel.m_floats[3] = 0.0;
        if (stepPositionsMultiDof(float,float*,float*)::jointOri == '\0') {
          stepPositionsMultiDof();
        }
        stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats = *(btQuadWord *)pabVar8;
        stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
                  ((anon_struct_1_0_00000001 *)&stepPositionsMultiDof::jointVel,
                   (btVector3 *)&stepPositionsMultiDof::jointOri,(btQuaternion *)0x0,SUB81(pbVar6,0)
                   ,dt);
        (*pabVar8)[0] = stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[0];
        *(btScalar *)((long)*pabVar8 + 4) =
             stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[1];
        *(btScalar *)((long)*pabVar8 + 8) =
             stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[2];
        *(btScalar *)((long)*pabVar8 + 0xc) =
             stepPositionsMultiDof::jointOri.super_btQuadWord.m_floats[3];
      }
      else if (uVar2 == 3) {
        lVar5 = (long)*(int *)((long)(pbVar3->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                              lVar12 + -8);
        pbVar6 = (this->m_realBuf).m_data;
        fVar13 = pbVar6[lVar5 + 6] * dt + (*pabVar8)[0];
        (*pabVar8)[0] = fVar13;
        fVar14 = pbVar6[lVar5 + 7];
        fVar15 = pbVar6[lVar5 + 8];
        fVar21 = *(float *)((long)pbVar3->m_axes[2].m_bottomVec.m_floats + lVar12) * fVar15 +
                 *(float *)((long)pbVar3->m_axes[1].m_bottomVec.m_floats + lVar12) * fVar14;
        fVar18 = *(float *)((long)pbVar3->m_axes[2].m_bottomVec.m_floats + lVar12 + 4) * fVar15 +
                 *(float *)((long)pbVar3->m_axes[1].m_bottomVec.m_floats + lVar12 + 4) * fVar14;
        fVar20 = fVar15 * *(float *)((long)pbVar3->m_axes[2].m_bottomVec.m_floats + lVar12 + 8) +
                 fVar14 * *(float *)((long)pbVar3->m_axes[1].m_bottomVec.m_floats + lVar12 + 8);
        fVar14 = *(float *)((long)pbVar3->m_axes[0].m_topVec.m_floats + lVar12);
        fVar15 = *(float *)((long)pbVar3->m_axes[0].m_topVec.m_floats + lVar12 + 4);
        fVar16 = *(float *)((long)pbVar3->m_axes[0].m_topVec.m_floats + lVar12 + 8);
        fVar13 = sinf(fVar13 * 0.5);
        fVar13 = fVar13 / SQRT(fVar16 * fVar16 + fVar14 * fVar14 + fVar15 * fVar15);
        fVar15 = *(float *)((long)pbVar3->m_axes[0].m_topVec.m_floats + lVar12) * fVar13;
        fVar16 = *(float *)((long)pbVar3->m_axes[0].m_topVec.m_floats + lVar12 + 4) * fVar13;
        fVar13 = fVar13 * *(float *)((long)pbVar3->m_axes[0].m_topVec.m_floats + lVar12 + 8);
        fVar14 = cosf((*pabVar8)[0] * 0.5);
        fVar19 = (fVar14 * fVar21 + fVar20 * fVar16) - fVar13 * fVar18;
        fVar17 = (fVar14 * fVar18 + fVar21 * fVar13) - fVar15 * fVar20;
        fVar22 = (fVar14 * fVar20 + fVar18 * fVar15) - fVar16 * fVar21;
        fVar20 = (-fVar15 * fVar21 - fVar18 * fVar16) - fVar20 * fVar13;
        fVar18 = fVar22 * fVar16 + ((fVar14 * fVar19 - fVar20 * fVar15) - fVar17 * fVar13);
        fVar21 = fVar19 * fVar13 + ((fVar14 * fVar17 - fVar20 * fVar16) - fVar22 * fVar15);
        fVar14 = fVar17 * fVar15 + ((fVar14 * fVar22 - fVar20 * fVar13) - fVar19 * fVar16);
        pbVar3 = (this->m_links).m_data;
        *(float *)((long)*pabVar8 + 4) =
             (*(float *)((long)pbVar3->m_axes[1].m_bottomVec.m_floats + lVar12 + 8) * fVar14 +
             *(float *)((long)pbVar3->m_axes[1].m_bottomVec.m_floats + lVar12) * fVar18 +
             *(float *)((long)pbVar3->m_axes[1].m_bottomVec.m_floats + lVar12 + 4) * fVar21) * dt +
             *(btScalar *)((long)*pabVar8 + 4);
        *(float *)((long)*pabVar8 + 8) =
             (fVar14 * *(float *)((long)pbVar3->m_axes[2].m_bottomVec.m_floats + lVar12 + 8) +
             fVar18 * *(float *)((long)pbVar3->m_axes[2].m_bottomVec.m_floats + lVar12) +
             fVar21 * *(float *)((long)pbVar3->m_axes[2].m_bottomVec.m_floats + lVar12 + 4)) * dt +
             *(btScalar *)((long)*pabVar8 + 8);
      }
      btMultibodyLink::updateCacheMultiDof
                ((btMultibodyLink *)
                 ((long)(((this->m_links).m_data)->m_inertiaLocal).m_floats + lVar12 + -4),*pq_00);
      if (pq_00 == (btScalar (*) [4])0x0) {
        pq_00 = (btScalar (*) [4])0x0;
      }
      else {
        pq_00 = (btScalar (*) [4])
                ((long)*pq_00 +
                (long)*(int *)((long)((((this->m_links).m_data)->m_cachedWorldTransform).m_basis.
                                      m_el + -1) + lVar12) * 4);
      }
      if (pfVar7 == (float *)0x0) {
        pfVar7 = (float *)0x0;
      }
      else {
        pfVar7 = pfVar7 + *(int *)((long)(((this->m_links).m_data)->m_cachedWorldTransform).m_basis.
                                         m_el[0].m_floats + lVar12 + -0x14);
      }
      lVar12 = lVar12 + 600;
    } while ((ulong)uVar1 * 600 != lVar12);
  }
  return;
}

Assistant:

void btMultiBody::stepPositionsMultiDof(btScalar dt, btScalar *pq, btScalar *pqd)
{	
	int num_links = getNumLinks();
    // step position by adding dt * velocity
	//btVector3 v = getBaseVel();	
    //m_basePos += dt * v;
	//
	btScalar *pBasePos = (pq ? &pq[4] : m_basePos);
	btScalar *pBaseVel = (pqd ? &pqd[3] : &m_realBuf[3]);			//note: the !pqd case assumes m_realBuf holds with base velocity at 3,4,5 (should be wrapped for safety)
	//	
	pBasePos[0] += dt * pBaseVel[0];
	pBasePos[1] += dt * pBaseVel[1];
	pBasePos[2] += dt * pBaseVel[2];

	///////////////////////////////
	//local functor for quaternion integration (to avoid error prone redundancy)
	struct
	{
		//"exponential map" based on btTransformUtil::integrateTransform(..)
		void operator() (const btVector3 &omega, btQuaternion &quat, bool baseBody, btScalar dt)
		{
			//baseBody	=>	quat is alias and omega is global coor
			//!baseBody	=>	quat is alibi and omega is local coor	
			
			btVector3 axis;
			btVector3 angvel;

			if(!baseBody)			
				angvel = quatRotate(quat, omega);				//if quat is not m_baseQuat, it is alibi => ok			
			else
				angvel = omega;
		
			btScalar fAngle = angvel.length(); 		
			//limit the angular motion
			if (fAngle * dt > ANGULAR_MOTION_THRESHOLD)
			{
				fAngle = btScalar(0.5)*SIMD_HALF_PI / dt;
			}

			if ( fAngle < btScalar(0.001) )
			{
				// use Taylor's expansions of sync function
				axis   = angvel*( btScalar(0.5)*dt-(dt*dt*dt)*(btScalar(0.020833333333))*fAngle*fAngle );
			}
			else
			{
				// sync(fAngle) = sin(c*fAngle)/t
				axis   = angvel*( btSin(btScalar(0.5)*fAngle*dt)/fAngle );
			}
			
			if(!baseBody)				
				quat = btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat;			
			else			
				quat = quat * btQuaternion(-axis.x(),-axis.y(),-axis.z(),btCos( fAngle*dt*btScalar(0.5) ));
				//equivalent to: quat = (btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat.inverse()).inverse();			
		
			quat.normalize();
		}
	} pQuatUpdateFun;
	///////////////////////////////

	//pQuatUpdateFun(getBaseOmega(), m_baseQuat, true, dt);
	//	
	btScalar *pBaseQuat = pq ? pq : m_baseQuat;	
	btScalar *pBaseOmega = pqd ? pqd : &m_realBuf[0];		//note: the !pqd case assumes m_realBuf starts with base omega (should be wrapped for safety)
	//
	static btQuaternion baseQuat; baseQuat.setValue(pBaseQuat[0], pBaseQuat[1], pBaseQuat[2], pBaseQuat[3]);
	static btVector3 baseOmega; baseOmega.setValue(pBaseOmega[0], pBaseOmega[1], pBaseOmega[2]);
	pQuatUpdateFun(baseOmega, baseQuat, true, dt);
	pBaseQuat[0] = baseQuat.x();
	pBaseQuat[1] = baseQuat.y();
	pBaseQuat[2] = baseQuat.z();
	pBaseQuat[3] = baseQuat.w();


	//printf("pBaseOmega = %.4f %.4f %.4f\n", pBaseOmega->x(), pBaseOmega->y(), pBaseOmega->z());
	//printf("pBaseVel = %.4f %.4f %.4f\n", pBaseVel->x(), pBaseVel->y(), pBaseVel->z());
	//printf("baseQuat = %.4f %.4f %.4f %.4f\n", pBaseQuat->x(), pBaseQuat->y(), pBaseQuat->z(), pBaseQuat->w());

	if(pq)		
		pq += 7;
	if(pqd)
		pqd += 6;

	// Finally we can update m_jointPos for each of the m_links
    for (int i = 0; i < num_links; ++i) 
	{
		btScalar *pJointPos = (pq ? pq : &m_links[i].m_jointPos[0]);		
		btScalar *pJointVel = (pqd ? pqd : getJointVelMultiDof(i));

		switch(m_links[i].m_jointType)
		{
			case btMultibodyLink::ePrismatic:
			case btMultibodyLink::eRevolute:
			{
				btScalar jointVel = pJointVel[0];	
				pJointPos[0] += dt * jointVel;
				break;
			}
			case btMultibodyLink::eSpherical:
			{
				static btVector3 jointVel; jointVel.setValue(pJointVel[0], pJointVel[1], pJointVel[2]);
				static btQuaternion jointOri; jointOri.setValue(pJointPos[0], pJointPos[1], pJointPos[2], pJointPos[3]);
				pQuatUpdateFun(jointVel, jointOri, false, dt);
				pJointPos[0] = jointOri.x(); pJointPos[1] = jointOri.y(); pJointPos[2] = jointOri.z(); pJointPos[3] = jointOri.w();
				break;
			}
			case btMultibodyLink::ePlanar:
			{
				pJointPos[0] += dt * getJointVelMultiDof(i)[0];

				btVector3 q0_coors_qd1qd2 = getJointVelMultiDof(i)[1] * m_links[i].getAxisBottom(1) + getJointVelMultiDof(i)[2] * m_links[i].getAxisBottom(2);
				btVector3 no_q0_coors_qd1qd2 = quatRotate(btQuaternion(m_links[i].getAxisTop(0), pJointPos[0]), q0_coors_qd1qd2);
				pJointPos[1] += m_links[i].getAxisBottom(1).dot(no_q0_coors_qd1qd2) * dt;
				pJointPos[2] += m_links[i].getAxisBottom(2).dot(no_q0_coors_qd1qd2) * dt;

				break;
			}
			default:
			{
			}

		}

		m_links[i].updateCacheMultiDof(pq);

		if(pq)		
			pq += m_links[i].m_posVarCount;
		if(pqd)
			pqd += m_links[i].m_dofCount;
    }
}